

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

Token slang::parsing::Token::createExpected
                (BumpAllocator *alloc,Diagnostics *diagnostics,Token actual,TokenKind expected,
                Token lastConsumed,Token matchingDelim)

{
  bool bVar1;
  reference this;
  Diagnostic *pDVar2;
  Info *pIVar3;
  DiagCode code;
  SourceLocation *pSVar4;
  SourceLocation SVar5;
  string_view sVar6;
  Token TVar7;
  
  pIVar3 = actual.info;
  if (lastConsumed.info == (Info *)0x0) {
    if (pIVar3 == (Info *)0x0) {
      pSVar4 = (SourceLocation *)&SourceLocation::NoLocation;
    }
    else {
      pSVar4 = &pIVar3->location;
    }
    SVar5 = *pSVar4;
  }
  else {
    SVar5 = (lastConsumed.info)->location;
    sVar6 = rawText(&lastConsumed);
    SVar5 = (SourceLocation)(sVar6._M_len * 0x10000000 + (long)SVar5);
  }
  if ((diagnostics->super_SmallVector<slang::Diagnostic,_2UL>).
      super_SmallVectorBase<slang::Diagnostic>.len != 0) {
    this = SmallVectorBase<slang::Diagnostic>::back
                     ((SmallVectorBase<slang::Diagnostic> *)diagnostics);
    bVar1 = Diagnostic::isError(this);
    if (bVar1) {
      if (this->location == SVar5) goto LAB_001884ec;
      if (pIVar3 == (Info *)0x0) {
        pSVar4 = (SourceLocation *)&SourceLocation::NoLocation;
      }
      else {
        pSVar4 = &pIVar3->location;
      }
      if (this->location == *pSVar4) goto LAB_001884ec;
    }
  }
  switch(expected) {
  case Identifier:
    code.subsystem = Parser;
    code.code = 0x31;
    break;
  case SystemIdentifier:
  case IntegerBase:
  case UnbasedUnsizedLiteral:
  case RealLiteral:
switchD_00188447_caseD_3:
    pDVar2 = Diagnostics::add(diagnostics,(DiagCode)0x460005,SVar5);
    sVar6 = LexerFacts::getTokenKindText(expected);
    Diagnostic::operator<<(pDVar2,sVar6);
    if (matchingDelim.info != (Info *)0x0) {
      pDVar2 = Diagnostic::addNote(pDVar2,(DiagCode)0x900005,(matchingDelim.info)->location);
      sVar6 = LexerFacts::getTokenKindText(matchingDelim.kind);
      Diagnostic::operator<<(pDVar2,sVar6);
    }
    goto LAB_001884ec;
  case StringLiteral:
    code.subsystem = Parser;
    code.code = 0x44;
    break;
  case IntegerLiteral:
    code.subsystem = Parser;
    code.code = 0x33;
    break;
  case TimeLiteral:
    code.subsystem = Preprocessor;
    code.code = 10;
    break;
  default:
    if (expected != IncludeFileName) goto switchD_00188447_caseD_3;
    code.subsystem = Preprocessor;
    code.code = 4;
  }
  Diagnostics::add(diagnostics,code,SVar5);
LAB_001884ec:
  TVar7 = createMissing(alloc,expected,SVar5);
  return TVar7;
}

Assistant:

Token Token::createExpected(BumpAllocator& alloc, Diagnostics& diagnostics, Token actual,
                            TokenKind expected, Token lastConsumed, Token matchingDelim) {
    // Figure out the best place to report this error based on the current
    // token as well as the last real token we consumed.
    SourceLocation location;
    if (!lastConsumed)
        location = actual.location();
    else {
        location = lastConsumed.location();
        location = location + lastConsumed.rawText().length();
    }

    // If there is already a diagnostic issued for this location, don't report this
    // one as well since it will just lead to lots of spam and the first error is
    // probably the thing that actually caused the issue.
    bool report = true;
    if (!diagnostics.empty()) {
        const Diagnostic& diag = diagnostics.back();
        if (diag.isError() && (diag.location == location || diag.location == actual.location()))
            report = false;
    }

    if (report) {
        switch (expected) {
            case TokenKind::Identifier:
                diagnostics.add(diag::ExpectedIdentifier, location);
                break;
            case TokenKind::StringLiteral:
                diagnostics.add(diag::ExpectedStringLiteral, location);
                break;
            case TokenKind::IntegerLiteral:
                diagnostics.add(diag::ExpectedIntegerLiteral, location);
                break;
            case TokenKind::TimeLiteral:
                diagnostics.add(diag::ExpectedTimeLiteral, location);
                break;
            case TokenKind::IncludeFileName:
                diagnostics.add(diag::ExpectedIncludeFileName, location);
                break;
            default: {
                auto& diag = diagnostics.add(diag::ExpectedToken, location);
                diag << LexerFacts::getTokenKindText(expected);
                if (matchingDelim) {
                    diag.addNote(diag::NoteToMatchThis, matchingDelim.location())
                        << LexerFacts::getTokenKindText(matchingDelim.kind);
                }
                break;
            }
        }
    }
    return Token::createMissing(alloc, expected, location);
}